

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O1

void __thiscall
Js::DynamicTypeHandler::VerifyObjectHeaderInlinedTypeHandler(DynamicTypeHandler *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (this->offsetOfInlineSlots != 0x10) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                ,0xd1,"(IsObjectHeaderInlined(GetOffsetOfInlineSlots()))",
                                "IsObjectHeaderInlined(GetOffsetOfInlineSlots())");
    if (!bVar2) goto LAB_00e60426;
    *puVar3 = 0;
  }
  if (this->inlineSlotCapacity < 2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                ,0xd2,
                                "(GetInlineSlotCapacity() >= GetObjectHeaderInlinableSlotCapacity())"
                                ,"GetInlineSlotCapacity() >= GetObjectHeaderInlinableSlotCapacity()"
                               );
    if (!bVar2) goto LAB_00e60426;
    *puVar3 = 0;
  }
  if (this->slotCapacity != (uint)this->inlineSlotCapacity) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                ,0xd3,"(GetInlineSlotCapacity() == GetSlotCapacity())",
                                "GetInlineSlotCapacity() == GetSlotCapacity()");
    if (!bVar2) {
LAB_00e60426:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

void DynamicTypeHandler::VerifyObjectHeaderInlinedTypeHandler() const
    {
        Assert(IsObjectHeaderInlined(GetOffsetOfInlineSlots()));
        Assert(GetInlineSlotCapacity() >= GetObjectHeaderInlinableSlotCapacity());
        Assert(GetInlineSlotCapacity() == GetSlotCapacity());
    }